

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O1

void __thiscall
cmDebugger::cmDebuggerAdapter::cmDebuggerAdapter
          (cmDebuggerAdapter *this,shared_ptr<cmDebugger::cmDebuggerConnection> *connection,
          string *dapLogPath)

{
  size_type sVar1;
  undefined8 this_00;
  _Storage<std::shared_ptr<dap::Writer>,_false> local_58;
  char local_48;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<cmDebugger::cmDebuggerConnection> local_30;
  
  local_30.super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (connection->super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  local_48 = '\0';
  local_30.super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (connection->super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (connection->super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (connection->super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  sVar1 = dapLogPath->_M_string_length;
  if (sVar1 != 0) {
    dap::file((dap *)&local_40,(dapLogPath->_M_dataplus)._M_p);
    local_58._M_value.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(local_40 + 8);
    if (local_40 == 0) {
      local_58._M_value.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    local_58._M_value.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Stack_38._M_pi;
    local_40 = 0;
    _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = '\x01';
  }
  cmDebuggerAdapter(this,&local_30,(optional<std::shared_ptr<dap::Writer>_> *)&local_58._M_value);
  if (sVar1 == 0) {
    if (local_48 == '\0') goto LAB_00391368;
    local_48 = '\0';
    this_00 = local_58._M_value.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  }
  else {
    this_00 = _Stack_38;
    if ((local_48 != '\0') &&
       (local_48 = '\0',
       local_58._M_value.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58._M_value.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_00 = _Stack_38;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
LAB_00391368:
  if (local_30.super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<cmDebugger::cmDebuggerConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

cmDebuggerAdapter::cmDebuggerAdapter(
  std::shared_ptr<cmDebuggerConnection> connection,
  std::string const& dapLogPath)
  : cmDebuggerAdapter(std::move(connection),
                      dapLogPath.empty()
                        ? cm::nullopt
                        : cm::optional<std::shared_ptr<dap::Writer>>(
                            dap::file(dapLogPath.c_str())))
{
}